

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_pcm_convert(void *pOut,ma_format formatOut,void *pIn,ma_format formatIn,
                   ma_uint64 sampleCount,ma_dither_mode ditherMode)

{
  float fVar1;
  char cVar2;
  undefined4 uVar3;
  ma_uint64 mVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  undefined1 *puVar8;
  char *pcVar9;
  double dVar10;
  float fVar11;
  double dVar12;
  
  if (formatOut == formatIn) {
    memcpy(pOut,pIn,*(uint *)(&DAT_0019a900 + (ulong)formatOut * 4) * sampleCount);
    return;
  }
  switch(formatIn) {
  case ma_format_u8:
    switch(formatOut) {
    case ma_format_s16:
      if (sampleCount != 0) {
        mVar4 = 0;
        do {
          *(ushort *)((long)pOut + mVar4 * 2) = (ushort)*(byte *)((long)pIn + mVar4) << 8 ^ 0x8000;
          mVar4 = mVar4 + 1;
        } while (sampleCount != mVar4);
      }
      break;
    case ma_format_s24:
      if (sampleCount != 0) {
        pcVar9 = (char *)((long)pOut + 2);
        mVar4 = 0;
        do {
          cVar2 = *(char *)((long)pIn + mVar4);
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          *pcVar9 = cVar2 + -0x80;
          mVar4 = mVar4 + 1;
          pcVar9 = pcVar9 + 3;
        } while (sampleCount != mVar4);
      }
      break;
    case ma_format_s32:
      if (sampleCount != 0) {
        mVar4 = 0;
        do {
          *(uint *)((long)pOut + mVar4 * 4) = (*(byte *)((long)pIn + mVar4) ^ 0xffffff80) << 0x18;
          mVar4 = mVar4 + 1;
        } while (sampleCount != mVar4);
      }
      break;
    case ma_format_f32:
      if (sampleCount != 0) {
        mVar4 = 0;
        do {
          *(float *)((long)pOut + mVar4 * 4) =
               (float)*(byte *)((long)pIn + mVar4) * 0.007843138 + -1.0;
          mVar4 = mVar4 + 1;
        } while (sampleCount != mVar4);
      }
    }
    break;
  case ma_format_s16:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_s16_to_u8(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s24:
      if (sampleCount != 0) {
        puVar8 = (undefined1 *)((long)pOut + 2);
        mVar4 = 0;
        do {
          puVar8[-2] = 0;
          puVar8[-1] = *(undefined1 *)((long)pIn + mVar4 * 2);
          *puVar8 = *(undefined1 *)((long)pIn + mVar4 * 2 + 1);
          mVar4 = mVar4 + 1;
          puVar8 = puVar8 + 3;
        } while (sampleCount != mVar4);
      }
      break;
    case ma_format_s32:
      if (sampleCount != 0) {
        mVar4 = 0;
        do {
          *(uint *)((long)pOut + mVar4 * 4) = (uint)*(ushort *)((long)pIn + mVar4 * 2) << 0x10;
          mVar4 = mVar4 + 1;
        } while (sampleCount != mVar4);
      }
      break;
    case ma_format_f32:
      if (sampleCount != 0) {
        mVar4 = 0;
        do {
          *(float *)((long)pOut + mVar4 * 4) =
               (float)(int)*(short *)((long)pIn + mVar4 * 2) * 3.0517578e-05;
          mVar4 = mVar4 + 1;
        } while (sampleCount != mVar4);
      }
    }
    break;
  case ma_format_s24:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_s24_to_u8(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s16:
      ma_pcm_s24_to_s16(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s32:
      if (sampleCount != 0) {
        pbVar7 = (byte *)((long)pIn + 2);
        mVar4 = 0;
        do {
          *(uint *)((long)pOut + mVar4 * 4) =
               (uint)*pbVar7 << 0x18 | (uint)*(ushort *)(pbVar7 + -2) << 8;
          mVar4 = mVar4 + 1;
          pbVar7 = pbVar7 + 3;
        } while (sampleCount != mVar4);
      }
      break;
    case ma_format_f32:
      if (sampleCount != 0) {
        pbVar7 = (byte *)((long)pIn + 2);
        mVar4 = 0;
        do {
          *(float *)((long)pOut + mVar4 * 4) =
               (float)((int)((uint)*pbVar7 << 0x18 | (uint)*(ushort *)(pbVar7 + -2) << 8) >> 8) *
               1.1920929e-07;
          mVar4 = mVar4 + 1;
          pbVar7 = pbVar7 + 3;
        } while (sampleCount != mVar4);
      }
    }
    break;
  case ma_format_s32:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_s32_to_u8(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s16:
      ma_pcm_s32_to_s16(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s24:
      if (sampleCount != 0) {
        puVar8 = (undefined1 *)((long)pOut + 2);
        mVar4 = 0;
        do {
          uVar3 = *(undefined4 *)((long)pIn + mVar4 * 4);
          puVar8[-2] = (char)((uint)uVar3 >> 8);
          puVar8[-1] = (char)((uint)uVar3 >> 0x10);
          *puVar8 = (char)((uint)uVar3 >> 0x18);
          mVar4 = mVar4 + 1;
          puVar8 = puVar8 + 3;
        } while (sampleCount != mVar4);
      }
      break;
    case ma_format_f32:
      if (sampleCount != 0) {
        mVar4 = 0;
        do {
          *(float *)((long)pOut + mVar4 * 4) = (float)*(int *)((long)pIn + mVar4 * 4) * 4.656613e-10
          ;
          mVar4 = mVar4 + 1;
        } while (sampleCount != mVar4);
      }
    }
    break;
  case ma_format_f32:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_f32_to_u8(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s16:
      ma_pcm_f32_to_s16(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s24:
      if (sampleCount != 0) {
        puVar8 = (undefined1 *)((long)pOut + 2);
        mVar4 = 0;
        do {
          fVar1 = *(float *)((long)pIn + mVar4 * 4);
          iVar6 = -0x7fffff;
          if (-1.0 <= fVar1) {
            fVar11 = 1.0;
            if (fVar1 <= 1.0) {
              fVar11 = fVar1;
            }
            iVar6 = (int)(fVar11 * 8388607.0);
          }
          puVar8[-2] = (char)iVar6;
          puVar8[-1] = (char)((uint)iVar6 >> 8);
          *puVar8 = (char)((uint)iVar6 >> 0x10);
          mVar4 = mVar4 + 1;
          puVar8 = puVar8 + 3;
        } while (sampleCount != mVar4);
      }
      break;
    case ma_format_s32:
      if (sampleCount != 0) {
        uVar5 = 0;
        do {
          fVar1 = *(float *)((long)pIn + uVar5 * 4);
          iVar6 = -0x7fffffff;
          if (-1.0 <= fVar1) {
            dVar10 = (double)fVar1;
            dVar12 = 1.0;
            if (dVar10 <= 1.0) {
              dVar12 = dVar10;
            }
            iVar6 = (int)(dVar12 * 2147483647.0);
          }
          *(int *)((long)pOut + uVar5 * 4) = iVar6;
          uVar5 = uVar5 + 1;
        } while ((uVar5 & 0xffffffff) < sampleCount);
      }
    }
  }
  return;
}

Assistant:

MA_API void ma_pcm_convert(void* pOut, ma_format formatOut, const void* pIn, ma_format formatIn, ma_uint64 sampleCount, ma_dither_mode ditherMode)
{
    if (formatOut == formatIn) {
        ma_copy_memory_64(pOut, pIn, sampleCount * ma_get_bytes_per_sample(formatOut));
        return;
    }

    switch (formatIn)
    {
        case ma_format_u8:
        {
            switch (formatOut)
            {
                case ma_format_s16: ma_pcm_u8_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_u8_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_u8_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_u8_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_s16:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_s16_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_s16_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_s16_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_s16_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_s24:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_s24_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s16: ma_pcm_s24_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_s24_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_s24_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_s32:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_s32_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s16: ma_pcm_s32_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_s32_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_s32_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_f32:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_f32_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s16: ma_pcm_f32_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_f32_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_f32_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        default: break;
    }
}